

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_readwrite.c
# Opt level: O0

void glist_readatoms(_glist *x,int natoms,t_atom *vec,int *p_nextmsg,t_symbol *templatesym,t_word *w
                    ,int argc,t_atom *argv)

{
  int iVar1;
  _array *x_00;
  t_symbol *s;
  _binbuf *x_01;
  int argc_00;
  int iVar2;
  t_template *template_00;
  t_template *ptVar3;
  _binbuf *x_02;
  t_atom *argv_00;
  bool bVar4;
  int local_90;
  int last;
  int first;
  _binbuf *z;
  int nline;
  t_word *element;
  t_template *arraytemplate;
  t_symbol *arraytemplatesym;
  int nitems;
  int elemsize;
  _array *a;
  t_template *template;
  int i;
  int n;
  int message;
  t_word *w_local;
  t_symbol *templatesym_local;
  int *p_nextmsg_local;
  t_atom *vec_local;
  _glist *p_Stack_10;
  int natoms_local;
  _glist *x_local;
  
  _n = w;
  w_local = (t_word *)templatesym;
  templatesym_local = (t_symbol *)p_nextmsg;
  p_nextmsg_local = (int *)vec;
  vec_local._4_4_ = natoms;
  p_Stack_10 = x;
  template_00 = template_findbyname(templatesym);
  if (template_00 == (t_template *)0x0) {
    pd_error((void *)0x0,"%s: no such template",w_local->w_symbol);
    *(int *)&templatesym_local->s_name = vec_local._4_4_;
  }
  else {
    word_restore(_n,template_00,argc,argv);
    iVar1 = template_00->t_n;
    for (template._4_4_ = 0; template._4_4_ < iVar1; template._4_4_ = template._4_4_ + 1) {
      if (template_00->t_vec[template._4_4_].ds_type == 3) {
        x_00 = _n[template._4_4_].w_array;
        iVar2 = x_00->a_elemsize;
        arraytemplatesym._0_4_ = 0;
        s = template_00->t_vec[template._4_4_].ds_arraytemplate;
        ptVar3 = template_findbyname(s);
        if (ptVar3 == (t_template *)0x0) {
          pd_error((void *)0x0,"%s: no such template",s->s_name);
        }
        else {
          while (argc_00 = canvas_scanbinbuf(vec_local._4_4_,(t_atom *)p_nextmsg_local,&i,
                                             (int *)templatesym_local), argc_00 != 0) {
            array_resize(x_00,(int)arraytemplatesym + 1);
            glist_readatoms(p_Stack_10,vec_local._4_4_,(t_atom *)p_nextmsg_local,
                            (int *)templatesym_local,s,
                            (t_word *)(x_00->a_vec + (int)arraytemplatesym * iVar2),argc_00,
                            (t_atom *)(p_nextmsg_local + (long)i * 4));
            arraytemplatesym._0_4_ = (int)arraytemplatesym + 1;
          }
        }
      }
      else if (template_00->t_vec[template._4_4_].ds_type == 2) {
        x_02 = binbuf_new();
        iVar2 = *(int *)&templatesym_local->s_name;
        local_90 = iVar2;
        while( true ) {
          bVar4 = false;
          if (local_90 < vec_local._4_4_) {
            bVar4 = p_nextmsg_local[(long)local_90 * 4] != 4;
          }
          if (!bVar4) break;
          local_90 = local_90 + 1;
        }
        binbuf_restore(x_02,local_90 - iVar2,(t_atom *)(p_nextmsg_local + (long)iVar2 * 4));
        x_01 = _n[template._4_4_].w_binbuf;
        iVar2 = binbuf_getnatom(x_02);
        argv_00 = binbuf_getvec(x_02);
        binbuf_add(x_01,iVar2,argv_00);
        binbuf_free(x_02);
        local_90 = local_90 + 1;
        if (vec_local._4_4_ < local_90) {
          local_90 = vec_local._4_4_;
        }
        *(int *)&templatesym_local->s_name = local_90;
      }
    }
  }
  return;
}

Assistant:

static void glist_readatoms(t_glist *x, int natoms, t_atom *vec,
    int *p_nextmsg, t_symbol *templatesym, t_word *w, int argc, t_atom *argv)
{
    int message, n, i;

    t_template *template = template_findbyname(templatesym);
    if (!template)
    {
        pd_error(0, "%s: no such template", templatesym->s_name);
        *p_nextmsg = natoms;
        return;
    }
    word_restore(w, template, argc, argv);
    n = template->t_n;
    for (i = 0; i < n; i++)
    {
        if (template->t_vec[i].ds_type == DT_ARRAY)
        {
            t_array *a = w[i].w_array;
            int elemsize = a->a_elemsize, nitems = 0;
            t_symbol *arraytemplatesym = template->t_vec[i].ds_arraytemplate;
            t_template *arraytemplate =
                template_findbyname(arraytemplatesym);
            if (!arraytemplate)
            {
                pd_error(0, "%s: no such template", arraytemplatesym->s_name);
            }
            else while (1)
            {
                t_word *element;
                int nline = canvas_scanbinbuf(natoms, vec, &message, p_nextmsg);
                    /* empty line terminates array */
                if (!nline)
                    break;
                array_resize(a, nitems + 1);
                element = (t_word *)(((char *)a->a_vec) +
                    nitems * elemsize);
                glist_readatoms(x, natoms, vec, p_nextmsg, arraytemplatesym,
                    element, nline, vec + message);
                nitems++;
            }
        }
        else if (template->t_vec[i].ds_type == DT_TEXT)
        {
            t_binbuf *z = binbuf_new();
            int first = *p_nextmsg, last;
            for (last = first; last < natoms && vec[last].a_type != A_SEMI;
                last++);
            binbuf_restore(z, last-first, vec+first);
            binbuf_add(w[i].w_binbuf, binbuf_getnatom(z), binbuf_getvec(z));
            binbuf_free(z);
            last++;
            if (last > natoms) last = natoms;
            *p_nextmsg = last;
        }
    }
}